

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi_loadf_from_callbacks
                  (stbi_io_callbacks *clbk,void *user,int *x,int *y,int *comp,int req_comp)

{
  float *pfVar1;
  stbi__context s;
  stbi__context sStack_108;
  
  sStack_108.io.eof = clbk->eof;
  sStack_108.img_buffer = sStack_108.buffer_start;
  sStack_108.io.read = clbk->read;
  sStack_108.io.skip = clbk->skip;
  sStack_108.read_from_callbacks = 1;
  sStack_108.buflen = 0x80;
  sStack_108.callback_already_read = 0;
  sStack_108.io_user_data = user;
  sStack_108.img_buffer_original = sStack_108.img_buffer;
  stbi__refill_buffer(&sStack_108);
  sStack_108.img_buffer_original_end = sStack_108.img_buffer_end;
  pfVar1 = stbi__loadf_main(&sStack_108,x,y,comp,req_comp);
  return pfVar1;
}

Assistant:

STBIDEF float *stbi_loadf_from_callbacks(stbi_io_callbacks const *clbk, void *user, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__loadf_main(&s,x,y,comp,req_comp);
}